

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-hang-loop.c
# Opt level: O0

void send_cb(uv_udp_send_t *req,int status)

{
  int status_local;
  uv_udp_send_t *req_local;
  
  send_cb_called = send_cb_called + 1;
  return;
}

Assistant:

static void send_cb(uv_udp_send_t* req, int status) {
  ASSERT_NOT_NULL(req);
  ASSERT(status == 0 || status == UV_ENETUNREACH);
  CHECK_OBJECT(req->handle, uv_udp_t, client);
  CHECK_OBJECT(req, uv_udp_send_t, send_req);
  req->handle = NULL;

  ASSERT(0 == uv_idle_start(&idle_handle, idle_cb));
}